

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerBinaryHelperMemWithTemp(Lowerer *this,Instr *instr,JnHelperMethod helperMethod)

{
  code *pcVar1;
  bool bVar2;
  OpLayoutType OVar3;
  undefined4 *puVar4;
  IntConstOpnd *opndArg;
  Instr *pIVar5;
  
  OVar3 = Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode);
  if (OVar3._value != 4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x226e,
                       "(Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg3)"
                       ,"Expected a binary instruction...");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((instr->field_0x36 & 2) == 0) {
    opndArg = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
    pIVar5 = LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  }
  else {
    pIVar5 = LoadHelperTemp(this,instr,instr);
  }
  LowerBinaryHelperMem(this,instr,helperMethod);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerBinaryHelperMemWithTemp(IR::Instr *instr, IR::JnHelperMethod helperMethod)
{
    AssertMsg(Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg3, "Expected a binary instruction...");

    IR::Instr * instrFirst;
    IR::Opnd * tempOpnd;

    if (instr->dstIsTempNumber)
    {
        instrFirst = this->LoadHelperTemp(instr, instr);
    }
    else
    {
        tempOpnd = IR::IntConstOpnd::New(0, TyInt32, this->m_func);
        instrFirst = m_lowererMD.LoadHelperArgument(instr, tempOpnd);
    }

    this->LowerBinaryHelperMem(instr, helperMethod);

    return instrFirst;
}